

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O0

int mbedtls_dhm_calc_secret
              (mbedtls_dhm_context *ctx,uchar *output,size_t output_size,size_t *olen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  size_t sVar1;
  undefined1 local_60 [8];
  mbedtls_mpi GYb;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  size_t *olen_local;
  size_t output_size_local;
  uchar *output_local;
  mbedtls_dhm_context *ctx_local;
  
  if ((ctx == (mbedtls_dhm_context *)0x0) || (output_size < ctx->len)) {
    return -0x3080;
  }
  GYb.p._4_4_ = dhm_check_range(&ctx->GY,&ctx->P);
  if (GYb.p._4_4_ != 0) {
    return GYb.p._4_4_;
  }
  mbedtls_mpi_init((mbedtls_mpi *)local_60);
  if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
    GYb.p._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)local_60,&ctx->GY);
  }
  else {
    GYb.p._4_4_ = dhm_update_blinding(ctx,f_rng,p_rng);
    if ((GYb.p._4_4_ != 0) ||
       (GYb.p._4_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)local_60,&ctx->GY,&ctx->Vi),
       GYb.p._4_4_ != 0)) goto LAB_0013fff3;
    GYb.p._4_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)local_60,(mbedtls_mpi *)local_60,&ctx->P);
  }
  if (GYb.p._4_4_ == 0) {
    GYb.p._4_4_ = 0;
    GYb.p._4_4_ = mbedtls_mpi_exp_mod(&ctx->K,(mbedtls_mpi *)local_60,&ctx->X,&ctx->P,&ctx->RP);
    if ((GYb.p._4_4_ == 0) &&
       ((f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0 ||
        ((GYb.p._4_4_ = mbedtls_mpi_mul_mpi(&ctx->K,&ctx->K,&ctx->Vf), GYb.p._4_4_ == 0 &&
         (GYb.p._4_4_ = mbedtls_mpi_mod_mpi(&ctx->K,&ctx->K,&ctx->P), GYb.p._4_4_ == 0)))))) {
      GYb.p._4_4_ = 0;
      sVar1 = mbedtls_mpi_size(&ctx->K);
      *olen = sVar1;
      GYb.p._4_4_ = mbedtls_mpi_write_binary(&ctx->K,output,*olen);
    }
  }
LAB_0013fff3:
  mbedtls_mpi_free((mbedtls_mpi *)local_60);
  if (GYb.p._4_4_ == 0) {
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = GYb.p._4_4_ + -0x3300;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_dhm_calc_secret( mbedtls_dhm_context *ctx,
                     unsigned char *output, size_t output_size, size_t *olen,
                     int (*f_rng)(void *, unsigned char *, size_t),
                     void *p_rng )
{
    int ret;
    mbedtls_mpi GYb;

    if( ctx == NULL || output_size < ctx->len )
        return( MBEDTLS_ERR_DHM_BAD_INPUT_DATA );

    if( ( ret = dhm_check_range( &ctx->GY, &ctx->P ) ) != 0 )
        return( ret );

    mbedtls_mpi_init( &GYb );

    /* Blind peer's value */
    if( f_rng != NULL )
    {
        MBEDTLS_MPI_CHK( dhm_update_blinding( ctx, f_rng, p_rng ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &GYb, &ctx->GY, &ctx->Vi ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &GYb, &GYb, &ctx->P ) );
    }
    else
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &GYb, &ctx->GY ) );

    /* Do modular exponentiation */
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &ctx->K, &GYb, &ctx->X,
                          &ctx->P, &ctx->RP ) );

    /* Unblind secret value */
    if( f_rng != NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &ctx->K, &ctx->K, &ctx->Vf ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &ctx->K, &ctx->K, &ctx->P ) );
    }

    *olen = mbedtls_mpi_size( &ctx->K );

    MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &ctx->K, output, *olen ) );

cleanup:
    mbedtls_mpi_free( &GYb );

    if( ret != 0 )
        return( MBEDTLS_ERR_DHM_CALC_SECRET_FAILED + ret );

    return( 0 );
}